

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_behavior(nk_flags *state,nk_rect r,nk_input *i,nk_button_behavior behavior)

{
  int iVar1;
  undefined4 local_3c;
  undefined4 local_38;
  int ret;
  nk_button_behavior behavior_local;
  nk_input *i_local;
  nk_flags *state_local;
  nk_rect r_local;
  
  local_38 = 0.0;
  if ((*state & 2) == 0) {
    *state = 4;
  }
  else {
    *state = 6;
  }
  if (i == (nk_input *)0x0) {
    r_local.w = 0.0;
  }
  else {
    iVar1 = nk_input_is_mouse_hovering_rect(i,r);
    if (iVar1 != 0) {
      *state = 0x12;
      iVar1 = nk_input_is_mouse_down(i,NK_BUTTON_LEFT);
      if (iVar1 != 0) {
        *state = 0x22;
      }
      iVar1 = nk_input_has_mouse_click_in_rect(i,NK_BUTTON_LEFT,r);
      if (iVar1 != 0) {
        if (behavior == NK_BUTTON_DEFAULT) {
          local_3c = (float)nk_input_is_mouse_pressed(i,NK_BUTTON_LEFT);
        }
        else {
          local_3c = (float)nk_input_is_mouse_down(i,NK_BUTTON_LEFT);
        }
        local_38 = local_3c;
      }
    }
    if (((*state & 0x10) == 0) || (iVar1 = nk_input_is_mouse_prev_hovering_rect(i,r), iVar1 != 0)) {
      iVar1 = nk_input_is_mouse_prev_hovering_rect(i,r);
      if (iVar1 != 0) {
        *state = *state | 0x40;
      }
    }
    else {
      *state = *state | 8;
    }
    r_local.w = local_38;
  }
  return (int)r_local.w;
}

Assistant:

NK_LIB int
nk_button_behavior(nk_flags *state, struct nk_rect r,
    const struct nk_input *i, enum nk_button_behavior behavior)
{
    int ret = 0;
    nk_widget_state_reset(state);
    if (!i) return 0;
    if (nk_input_is_mouse_hovering_rect(i, r)) {
        *state = NK_WIDGET_STATE_HOVERED;
        if (nk_input_is_mouse_down(i, NK_BUTTON_LEFT))
            *state = NK_WIDGET_STATE_ACTIVE;
        if (nk_input_has_mouse_click_in_rect(i, NK_BUTTON_LEFT, r)) {
            ret = (behavior != NK_BUTTON_DEFAULT) ?
                nk_input_is_mouse_down(i, NK_BUTTON_LEFT):
#ifdef NK_BUTTON_TRIGGER_ON_RELEASE
                nk_input_is_mouse_released(i, NK_BUTTON_LEFT);
#else
                nk_input_is_mouse_pressed(i, NK_BUTTON_LEFT);
#endif
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_LEFT;
    return ret;
}